

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O2

int ReadFileToCStringsList(CStringsList **f,char *end)

{
  int iVar1;
  char *in_RAX;
  CStringsList *this;
  bool SplitByColon;
  char *p;
  
  SplitByColon = true;
  p = in_RAX;
  while( true ) {
    iVar1 = ReadLineNoMacro(SplitByColon);
    if (iVar1 == 0) {
      return 0;
    }
    CompiledCurrentLine = CompiledCurrentLine + 1;
    p = line;
    SkipBlanks(&p);
    if (*p == '.') {
      p = p + 1;
    }
    iVar1 = cmphstr(&p,end,false);
    if (iVar1 != 0) break;
    this = (CStringsList *)operator_new(0x28);
    CStringsList::CStringsList(this,line,(CStringsList *)0x0);
    *f = this;
    f = &this->next;
    ListFile(true);
    if (SplitByColon == false) {
      iVar1 = cmphstr(&p,"endlua",false);
      SplitByColon = iVar1 != 0;
    }
    else {
      iVar1 = cmphstr(&p,"lua",false);
      SplitByColon = iVar1 == 0;
    }
  }
  lp = ReplaceDefine(p);
  return 1;
}

Assistant:

int ReadFileToCStringsList(CStringsList*& f, const char* end) {
	// f itself should be already NULL, not resetting it here
	CStringsList** s = &f;
	bool SplitByColon = true;
	while (ReadLineNoMacro(SplitByColon)) {
		++CompiledCurrentLine;
		char* p = line;
		SkipBlanks(p);
		if ('.' == *p) ++p;
		if (cmphstr(p, end)) {		// finished, read rest after end marker into line buffers
			lp = ReplaceDefine(p);
			return 1;
		}
		*s = new CStringsList(line);
		s = &((*s)->next);
		ListFile(true);
		// Try to ignore colons inside lua blocks... this is far from bulletproof, but should improve it
		if (SplitByColon && cmphstr(p, "lua")) {
			SplitByColon = false;
		} else if (!SplitByColon && cmphstr(p, "endlua")) {
			SplitByColon = true;
		}
	}
	return 0;
}